

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

int __thiscall Acceptor::listen(Acceptor *this,int __fd,int __n)

{
  EventLoop *this_00;
  bool bVar1;
  log_level lVar2;
  int iVar3;
  int extraout_EAX;
  Logger *pLVar4;
  anon_class_8_1_8991fb9c local_38;
  EventCallback local_30;
  Acceptor *local_10;
  Acceptor *this_local;
  
  local_10 = this;
  pLVar4 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar4);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","listen",0x37);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar4 = Logger::get_instance();
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp"
                      ,"listen",0x37,LOG_LEVEL_INFO,"acceptor execute listen, listen fd is %d\n",
                      this->ac_listen_fd);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  iVar3 = ::listen(this->ac_listen_fd,1000);
  if (iVar3 != -1) {
    this->ac_listening = true;
    this_00 = this->ac_loop;
    iVar3 = this->ac_listen_fd;
    local_38.this = this;
    std::function<void()>::function<Acceptor::listen()::__0,void>
              ((function<void()> *)&local_30,&local_38);
    EventLoop::add_to_poller(this_00,iVar3,1,&local_30);
    std::function<void_()>::~function(&local_30);
    return extraout_EAX;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] server listen error\n","error","listen",0x39);
  }
  exit(1);
}

Assistant:

void Acceptor::listen()
{
LOG_INFO("acceptor execute listen, listen fd is %d\n", ac_listen_fd);
    if (::listen(ac_listen_fd, 1000) == -1) {
        PR_ERROR("server listen error\n");
        exit(1);
    }
    ac_listening = true;
    ac_loop->add_to_poller(ac_listen_fd, EPOLLIN, [this](){ this->do_accept(); });
}